

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int btrimws(bstring b)

{
  int iVar1;
  ushort **ppuVar2;
  int local_20;
  int local_1c;
  int j;
  int i;
  bstring b_local;
  
  if ((((b == (bstring)0x0) || (b->data == (uchar *)0x0)) || (b->mlen < b->slen)) ||
     ((b->slen < 0 || (b->mlen < 1)))) {
    b_local._4_4_ = -1;
  }
  else {
    local_1c = b->slen;
    do {
      iVar1 = local_1c;
      local_1c = iVar1 + -1;
      if (local_1c < 0) {
        *b->data = '\0';
        b->slen = 0;
        return 0;
      }
      ppuVar2 = __ctype_b_loc();
    } while (((*ppuVar2)[(int)(uint)b->data[local_1c]] & 0x2000) != 0);
    if (local_1c < b->mlen) {
      b->data[iVar1] = '\0';
    }
    b->slen = iVar1;
    local_20 = 0;
    while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)b->data[local_20]] & 0x2000) != 0) {
      local_20 = local_20 + 1;
    }
    b_local._4_4_ = bdelete(b,0,local_20);
  }
  return b_local._4_4_;
}

Assistant:

int btrimws (bstring b) {
int i, j;

	if (b == NULL || b->data == NULL || b->mlen < b->slen ||
	    b->slen < 0 || b->mlen <= 0) return BSTR_ERR;

	for (i = b->slen - 1; i >= 0; i--) {
		if (!wspace (b->data[i])) {
			if (b->mlen > i) b->data[i+1] = (unsigned char) '\0';
			b->slen = i + 1;
			for (j = 0; wspace (b->data[j]); j++) {}
			return bdelete (b, 0, j);
		}
	}

	b->data[0] = (unsigned char) '\0';
	b->slen = 0;
	return BSTR_OK;
}